

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdPath.c
# Opt level: O1

void Sbc_ManAddInternalToPath(Gia_Man_t *p,Vec_Bit_t *vPath)

{
  Vec_Int_t *pVVar1;
  int *piVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  
  if (1 < p->nObjs) {
    uVar6 = 1;
    do {
      if ((long)p->vMapping->nSize <= (long)uVar6) {
LAB_00545775:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (p->vMapping->pArray[uVar6] != 0) {
        if ((long)vPath->nSize <= (long)uVar6) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecBit.h"
                        ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
        }
        if (((uint)vPath->pArray[uVar6 >> 5 & 0x7ffffff] >> ((uint)uVar6 & 0x1f) & 1) != 0) {
          Gia_ManIncrementTravId(p);
          pVVar1 = p->vMapping;
          lVar4 = (long)pVVar1->nSize;
          if (lVar4 <= (long)uVar6) goto LAB_00545775;
          piVar2 = pVVar1->pArray;
          lVar3 = 0;
          while( true ) {
            lVar5 = (long)piVar2[uVar6];
            if ((lVar5 < 0) || ((int)lVar4 <= piVar2[uVar6])) goto LAB_00545775;
            if (piVar2[lVar5] <= lVar3) break;
            if (p->nTravIdsAlloc <= piVar2[lVar5 + lVar3 + 1]) {
              __assert_fail("Id < p->nTravIdsAlloc",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                            ,0x266,"void Gia_ObjSetTravIdCurrentId(Gia_Man_t *, int)");
            }
            p->pTravIds[piVar2[lVar5 + lVar3 + 1]] = p->nTravIds;
            lVar3 = lVar3 + 1;
            lVar4 = (long)pVVar1->nSize;
            if (lVar4 <= (long)uVar6) goto LAB_00545775;
          }
          Sbc_ManAddInternalToPath_rec(p,(uint)uVar6,vPath);
        }
      }
      uVar6 = uVar6 + 1;
    } while ((long)uVar6 < (long)p->nObjs);
  }
  return;
}

Assistant:

void Sbc_ManAddInternalToPath( Gia_Man_t * p, Vec_Bit_t * vPath )
{
    int k, iFan, iObj;
    Gia_ManForEachLut( p, iObj )
    {
        if ( !Vec_BitEntry(vPath, iObj) )
            continue;
        Gia_ManIncrementTravId( p );
        Gia_LutForEachFanin( p, iObj, iFan, k )
            Gia_ObjSetTravIdCurrentId(p, iFan);
        Sbc_ManAddInternalToPath_rec( p, iObj, vPath );
    }
}